

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenThread.cpp
# Opt level: O2

void __thiscall
brynet::net::ListenThread::startListen
          (ListenThread *this,bool isIPV6,string *ip,int port,ACCEPT_CALLBACK *callback)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  sock fd;
  pointer p_Var3;
  runtime_error *prVar4;
  int *piVar5;
  __allocator_type __a2;
  long *local_c0;
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<brynet::net::ListenSocket,_(__gnu_cxx::_Lock_policy)2> local_a8;
  _Any_data local_98;
  long local_88;
  long lStack_80;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_70;
  shared_ptr<brynet::net::ListenSocket> listenSocket;
  __shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<bool> isRunListen;
  
  std::mutex::lock(&this->mListenThreadGuard);
  if ((this->mListenThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"accept callback is nullptr");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fd = base::Listen(isIPV6,(ip->_M_dataplus)._M_p,port,0x200);
    if (fd == -1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      piVar5 = __errno_location();
      std::runtime_error::runtime_error(prVar4,"listen error of:" + *piVar5);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->mIsIPV6 = isIPV6;
    local_70._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>
          *)CONCAT71(local_70._M_alloc._1_7_,1);
    std::make_shared<bool,bool>((bool *)&local_b8);
    std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__cxx11::string::_M_assign((string *)&this->mIP);
    this->mPort = port;
    ListenSocket::Create((ListenSocket *)&local_b8,fd);
    std::__shared_ptr<brynet::net::ListenSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<brynet::net::ListenSocket,brynet::net::ListenSocket::ListenSocketDeleter,void>
              ((__shared_ptr<brynet::net::ListenSocket,(__gnu_cxx::_Lock_policy)2> *)&listenSocket,
               (unique_ptr<brynet::net::ListenSocket,_brynet::net::ListenSocket::ListenSocketDeleter>
                *)&local_b8);
    if (local_b8._M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)local_b8._M_ptr + 8))();
    }
    std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&isRunListen.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,
               &(this->mRunListen).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,&isRunListen.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<brynet::net::ListenSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,
               &listenSocket.
                super___shared_ptr<brynet::net::ListenSocket,_(__gnu_cxx::_Lock_policy)2>);
    std::
    function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
    ::function((function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                *)&local_98,callback);
    local_50._M_ptr = (element_type *)0x0;
    p_Var3 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00154d80;
    (p_Var3->_M_impl)._M_storage._M_storage = (type)0x0;
    local_70._M_alloc = &__a2;
    local_70._M_ptr = p_Var3;
    local_c0 = (long *)operator_new(0x48);
    _Var2._M_pi = local_a8._M_refcount._M_pi;
    _Var1._M_pi = local_b8._M_refcount._M_pi;
    *local_c0 = (long)&PTR___State_impl_001551c8;
    local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c0[1] = (long)local_b8._M_ptr;
    local_c0[2] = (long)_Var1._M_pi;
    local_b8._M_ptr = (element_type *)0x0;
    local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c0[3] = (long)local_a8._M_ptr;
    local_c0[4] = (long)_Var2._M_pi;
    local_a8._M_ptr = (element_type *)0x0;
    local_c0[5] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[8] = lStack_80;
    if (local_88 != 0) {
      local_c0[5] = (long)local_98._M_unused._0_8_;
      local_c0[6] = local_98._8_8_;
      local_c0[7] = local_88;
      local_88 = 0;
      lStack_80 = 0;
    }
    std::thread::_M_start_thread(&p_Var3->_M_impl,&local_c0,0);
    if (local_c0 != (long *)0x0) {
      (**(code **)(*local_c0 + 8))();
    }
    local_70._M_ptr = (pointer)0x0;
    local_50._M_ptr = (element_type *)&p_Var3->_M_impl;
    local_50._M_refcount._M_pi = &p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_70);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mListenThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
               &local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    startListen(bool,std::__cxx11::string_const&,int,std::function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>)
    ::$_0::~__0((__0 *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&isRunListen.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&listenSocket.
                super___shared_ptr<brynet::net::ListenSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mListenThreadGuard);
  return;
}

Assistant:

void ListenThread::startListen(bool isIPV6, 
    const std::string& ip,
    int port,
    ACCEPT_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mListenThreadGuard);

    if (mListenThread != nullptr)
    {
        return;
    }
    if (callback == nullptr)
    {
        throw std::runtime_error("accept callback is nullptr");
    }

    sock fd = brynet::net::base::Listen(isIPV6, ip.c_str(), port, 512);
    if (fd == SOCKET_ERROR)
    {
        throw std::runtime_error("listen error of:" + sErrno);
    }

    mIsIPV6 = isIPV6;
    mRunListen = std::make_shared<bool>(true);
    mIP = ip;
    mPort = port;

    auto listenSocket = std::shared_ptr<ListenSocket>(ListenSocket::Create(fd));
    auto isRunListen = mRunListen;

    mListenThread = std::make_shared<std::thread>([isRunListen, listenSocket, callback]() mutable {
        while (*isRunListen)
        {
            auto clientSocket = runOnceListen(listenSocket);
            if (clientSocket == nullptr)
            {
                continue;
            }

            if (*isRunListen)
            {
                callback(std::move(clientSocket));
            }
        }
    });
}